

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBool
               (int field_number,bool value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  bool value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_VARINT,output);
  WriteBoolNoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteBool(int field_number, bool value,
                               io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteBoolNoTag(value, output);
}